

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O3

void conv_fmt_16to8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                        int src_stridec,int *dst_stride,int uv_shift)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  uchar *puVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  if (0 < height) {
    iVar3 = *dst_stride;
    puVar2 = *dst;
    iVar9 = 0;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          puVar2[uVar5] = src_y[uVar5 * 2];
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      puVar2 = puVar2 + iVar3;
      iVar9 = iVar9 + 1;
      src_y = src_y + (long)(src_stride >> 1) * 2;
    } while (iVar9 != height);
  }
  uVar1 = width >> ((byte)uv_shift & 0x1f);
  iVar3 = height >> ((byte)uv_shift & 0x1f);
  if (0 < iVar3) {
    iVar9 = dst_stride[1];
    puVar4 = dst[1];
    iVar8 = 0;
    puVar2 = src_uv;
    do {
      if (0 < (int)uVar1) {
        lVar7 = 0;
        puVar6 = puVar4;
        do {
          *puVar6 = puVar2[(long)(int)lVar7 * 2];
          lVar7 = lVar7 + 2;
          puVar6 = puVar6 + 1;
        } while ((ulong)uVar1 * 2 != lVar7);
      }
      puVar2 = puVar2 + (long)(src_stridec >> 1) * 2;
      puVar4 = puVar4 + iVar9;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar3);
    if (0 < iVar3) {
      iVar9 = dst_stride[2];
      puVar4 = dst[2];
      puVar2 = src_uv + 2;
      iVar8 = 0;
      do {
        if (0 < (int)uVar1) {
          lVar7 = 0;
          puVar6 = puVar4;
          do {
            *puVar6 = puVar2[(long)(int)lVar7 * 2];
            lVar7 = lVar7 + 2;
            puVar6 = puVar6 + 1;
          } while ((ulong)uVar1 * 2 != lVar7);
        }
        puVar2 = puVar2 + (long)(src_stridec >> 1) * 2;
        puVar4 = puVar4 + iVar9;
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar3);
    }
  }
  return;
}

Assistant:

static void conv_fmt_16to8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    unsigned char* pdst = dst[0];
    int i_dst, i_src;

    i_src = src_stride >> 1;
    i_dst = dst_stride[0];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = dst[2];
    i_dst = dst_stride[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}